

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

uint __thiscall Lodtalk::ClassTable::registerClass(ClassTable *this,Oop clazz)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  SharedMutex::write_lock(&this->sharedMutex);
  uVar2 = this->size >> 9;
  uVar3 = this->size & 0x1ff;
  if ((uVar3 == 0) &&
     (uVar2 == (long)(this->pageTable).
                     super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->pageTable).
                     super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3)) {
    allocatePage(this);
  }
  (this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
  super__Vector_impl_data._M_start[uVar2][uVar3].field_0 = clazz.field_0;
  *(ulong *)clazz.field_0 =
       *(ulong *)clazz.field_0 & 0xffffffff000003ff | (ulong)(uint)((int)this->size << 10);
  sVar1 = this->size;
  this->size = sVar1 + 1;
  SharedMutex::write_unlock(&this->sharedMutex);
  return (uint)sVar1;
}

Assistant:

unsigned int ClassTable::registerClass(Oop clazz)
{
    WriteLock<SharedMutex> l(sharedMutex);
    auto pageIndex = size / OopsPerPage;
    auto elementIndex = size % OopsPerPage;
    if(elementIndex == 0 && pageIndex == pageTable.size())
        allocatePage();

    pageTable[pageIndex][elementIndex] = clazz;
    clazz.header->identityHash = (unsigned int)size;
    return (unsigned int) (size++);
}